

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::LowerCondBranchCheckBailOut
          (Lowerer *this,BranchInstr *branchInstr,Instr *helperCall,bool isHelper)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  BailOutKind BVar4;
  BailOutKind BVar5;
  undefined4 *puVar6;
  Instr *instr;
  BailOutInfo *bailOutInfo;
  BailOutInstrTemplate<IR::Instr> *instr_00;
  Instr *pIVar7;
  
  if (((branchInstr->super_Instr).m_opcode & ~ExtendedOpcodePrefix) != BrFalse_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3078,
                       "(branchInstr->m_opcode == Js::OpCode::BrTrue_A || branchInstr->m_opcode == Js::OpCode::BrFalse_A)"
                       ,
                       "branchInstr->m_opcode == Js::OpCode::BrTrue_A || branchInstr->m_opcode == Js::OpCode::BrFalse_A"
                      );
    if (!bVar3) goto LAB_005da97c;
    *puVar6 = 0;
  }
  bVar1 = (branchInstr->super_Instr).field_0x38;
  if ((bVar1 & 0x10) != 0) {
    BVar4 = BailOutInvalid;
    if ((bVar1 & 0x40) != 0) {
      BVar4 = IR::Instr::GetBailOutKind(&branchInstr->super_Instr);
      if ((BVar4 & BailOutForDebuggerBits) != BailOutInvalid) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x3081,"(!(branchInstr->GetBailOutKind() & IR::BailOutForDebuggerBits))"
                           ,"There should be no debugger bits in main bailout kind.");
        if (!bVar3) goto LAB_005da97c;
        *puVar6 = 0;
      }
      BVar5 = IR::Instr::GetAuxBailOutKind(&branchInstr->super_Instr);
      BVar4 = BVar5 & BailOutForDebuggerBits;
      if ((BVar5 & (BailOutStep|BailOutExplicit|BailOutLocalValueChanged|BailOutStackFrameBase|
                   BailOutBreakPointInFunction)) != BailOutInvalid) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x3084,
                           "((debuggerBailOutKind & ~(IR::BailOutIgnoreException | IR::BailOutForceByFlag)) == 0)"
                           ,"Only IR::BailOutIgnoreException|ForceByFlag supported here.");
        if (!bVar3) {
LAB_005da97c:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
    }
    instr = SplitBailOnImplicitCall
                      (this,&branchInstr->super_Instr,helperCall,&branchInstr->super_Instr);
    pIVar7 = instr->m_prev;
    LowerBailoutCheckAndLabel(this,instr,instr->m_opcode == BailOnEqual,isHelper);
    GenerateBailOut(this,instr,branchInstr,(LabelInstr *)0x0,(LabelInstr *)0x0);
    if (BVar4 != BailOutInvalid) {
      bailOutInfo = IR::Instr::GetBailOutInfo(instr);
      instr_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                           (BailForDebugger,BVar4,bailOutInfo,bailOutInfo->bailOutFunc);
      IR::Instr::InsertAfter(pIVar7,&instr_00->super_Instr);
      LowerBailForDebugger(this,&instr_00->super_Instr,isHelper);
    }
  }
  pIVar7 = LowererMD::LowerCondBranch(&this->m_lowererMD,&branchInstr->super_Instr);
  return pIVar7;
}

Assistant:

IR::Instr *
Lowerer::LowerCondBranchCheckBailOut(IR::BranchInstr * branchInstr, IR::Instr * helperCall, bool isHelper)
{
    Assert(branchInstr->m_opcode == Js::OpCode::BrTrue_A || branchInstr->m_opcode == Js::OpCode::BrFalse_A);
    if (branchInstr->HasBailOutInfo())
    {
#ifdef ENABLE_SCRIPT_DEBUGGING
        IR::BailOutKind debuggerBailOutKind = IR::BailOutInvalid;
        if (branchInstr->HasAuxBailOut())
        {
            // We have shared debugger bailout. For branches we lower it here, not in SplitBailForDebugger.
            // See SplitBailForDebugger for details.
            AssertMsg(!(branchInstr->GetBailOutKind() & IR::BailOutForDebuggerBits), "There should be no debugger bits in main bailout kind.");

            debuggerBailOutKind = branchInstr->GetAuxBailOutKind() & IR::BailOutForDebuggerBits;
            AssertMsg((debuggerBailOutKind & ~(IR::BailOutIgnoreException | IR::BailOutForceByFlag)) == 0, "Only IR::BailOutIgnoreException|ForceByFlag supported here.");
        }
#endif

        IR::Instr * bailOutInstr = this->SplitBailOnImplicitCall(branchInstr, helperCall, branchInstr);
        IR::Instr* prevInstr = this->LowerBailOnEqualOrNotEqual(bailOutInstr, branchInstr, nullptr, nullptr, isHelper);

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (debuggerBailOutKind != IR::BailOutInvalid)
        {
            // Note that by this time implicit calls bailout is already lowered.
            // What we do here is use same bailout info and lower debugger bailout which would be shared bailout.
            BailOutInfo* bailOutInfo = bailOutInstr->GetBailOutInfo();
            IR::BailOutInstr* debuggerBailoutInstr = IR::BailOutInstr::New(
                Js::OpCode::BailForDebugger, debuggerBailOutKind, bailOutInfo, bailOutInfo->bailOutFunc);
            prevInstr->InsertAfter(debuggerBailoutInstr);
            // The result of that is:
            // original helper op_* instr, then debugger bailout, then implicit calls bailout/etc with the branch instr.
            // Example:
            //    s35(eax).i32    =  CALL           Op_GreaterEqual.u32                     # -- original op_* helper
            //    s34.i32         =  MOV            s35(eax).i32                            #
            //                       BailForDebugger                                        # Bailout: #0042 (BailOutIgnoreException) -- the debugger bailout
            //                       CMP            [0x0003BDE0].i8, 1 (0x1).i8             # -- implicit calls check
            //                       JEQ            $L10                                    #
            //$L11: [helper]                                                                #
            //                       CALL           SaveAllRegistersAndBranchBailOut.u32    # Bailout: #0042 (BailOutOnImplicitCalls)
            //                       JMP            $L5                                     #
            //$L10: [helper]                                                                #
            //                       BrFalse_A      $L3, s34.i32                            #0034 -- The BrTrue/BrFalse branch (branch instr)
            //$L6: [helper]                                                                 #0042

            this->LowerBailForDebugger(debuggerBailoutInstr, isHelper);
            // After lowering this we will have a check which on bailout condition will JMP to $L11.
        }
#else
        (prevInstr);
#endif
    }

    return m_lowererMD.LowerCondBranch(branchInstr);
}